

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LL.cpp
# Opt level: O2

void __thiscall ll_grammar::GrammarLeft::GrammarLeft(GrammarLeft *this,string *generate,int length)

{
  _Rb_tree_header *p_Var1;
  vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_> *pvVar2;
  long lVar3;
  vector<int,_std::allocator<int>_> *this_00;
  int iVar4;
  ostream *poVar5;
  pointer pEVar6;
  pointer pvVar7;
  int j;
  ulong uVar8;
  ulong uVar9;
  int i_1;
  char *pcVar10;
  int m;
  ulong uVar11;
  ulong uVar12;
  int i;
  long lVar13;
  bool bVar14;
  allocator local_209;
  ulong local_208;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_200;
  string finnalyC;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result_of_name;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  vectorGenrates;
  int index;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  _Vector_base<int,_std::allocator<int>_> local_c8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->name_of_keys)._M_t._M_impl.super__Rb_tree_header;
  (this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  pvVar2 = &this->elements;
  local_200 = &this->follow;
  uVar9 = 0;
  memset(&(this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0xb0);
  vectorGenrates.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < length) {
    uVar9 = (ulong)(uint)length;
  }
  vectorGenrates.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vectorGenrates.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar8 = uVar9;
  while (bVar14 = uVar8 != 0, uVar8 = uVar8 - 1, bVar14) {
    finnalyC._M_dataplus._M_p = (pointer)0x0;
    finnalyC._M_string_length = 0;
    finnalyC.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string((string *)&local_50,(string *)generate);
    public_tool::parse_productions
              (&local_50,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&finnalyC);
    std::__cxx11::string::~string((string *)&local_50);
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::push_back(&vectorGenrates,(value_type *)&finnalyC);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&finnalyC);
    generate = generate + 1;
  }
  for (lVar13 = 0; uVar9 * 0x18 - lVar13 != 0; lVar13 = lVar13 + 0x18) {
    std::__cxx11::string::string
              ((string *)&local_70,
               *(string **)
                ((long)&((vectorGenrates.
                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar13));
    add_element(this,&local_70,false);
    std::__cxx11::string::~string((string *)&local_70);
  }
  result_of_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result_of_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result_of_name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
    local_208 = uVar8 * 0x18;
    uVar12 = 1;
    while( true ) {
      lVar13 = *(long *)((long)&((vectorGenrates.
                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + local_208);
      if ((ulong)(*(long *)((long)&((vectorGenrates.
                                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish + local_208) - lVar13
                 >> 5) <= uVar12) break;
      std::__cxx11::string::string((string *)&local_e8,(string *)(lVar13 + uVar12 * 0x20));
      public_tool::parse_elem(&local_e8,&result_of_name);
      std::__cxx11::string::~string((string *)&local_e8);
      finnalyC.field_2._M_allocated_capacity = 0;
      finnalyC._M_dataplus._M_p = (pointer)0x0;
      finnalyC._M_string_length = 0;
      lVar13 = 0;
      for (uVar11 = 0;
          uVar11 < (ulong)((long)result_of_name.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)result_of_name.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar11 = uVar11 + 1) {
        std::__cxx11::string::string
                  ((string *)&local_90,
                   (string *)
                   ((long)&((result_of_name.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar13)
                  );
        iVar4 = find_name(this,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        index = iVar4;
        if (iVar4 == -2) {
          std::__cxx11::string::string
                    ((string *)&local_b0,
                     (string *)
                     ((long)&((result_of_name.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar13));
          index = add_element(this,&local_b0,true);
          std::__cxx11::string::~string((string *)&local_b0);
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&finnalyC,&index);
        lVar13 = lVar13 + 0x20;
      }
      std::__cxx11::string::string
                ((string *)&local_108,
                 *(string **)
                  ((long)&((vectorGenrates.
                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + local_208));
      iVar4 = find_name(this,&local_108);
      pEVar6 = (pvVar2->
               super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>).
               _M_impl.super__Vector_impl_data._M_start;
      base_grammar::Express::Express
                ((Express *)&local_c8,(vector<int,_std::allocator<int>_> *)&finnalyC);
      std::vector<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>::push_back
                (&pEVar6[iVar4].expression_of_set,(value_type *)&local_c8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c8);
      std::__cxx11::string::~string((string *)&local_108);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&finnalyC);
      uVar12 = uVar12 + 1;
    }
  }
  clear_left_recursion(this);
  clear_left_factor(this);
  std::__cxx11::string::string((string *)&local_128,"#",(allocator *)&finnalyC);
  add_element(this,&local_128,true);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string((string *)&finnalyC,"finnaly:",(allocator *)&index);
  uVar9 = 0;
  while( true ) {
    pEVar6 = (this->elements).
             super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->elements).
                       super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar6) / 0x48) <= uVar9)
    break;
    if (pEVar6[uVar9].super_Elem.is_finally == false) {
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)&pEVar6[uVar9].super_Elem.name);
      std::operator<<(poVar5,"->");
      uVar8 = 0;
      local_208 = uVar9;
      while( true ) {
        pEVar6 = (pvVar2->
                 super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        lVar13 = *(long *)&pEVar6[uVar9].expression_of_set.
                           super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>
                           ._M_impl.super__Vector_impl_data;
        if ((ulong)(((long)*(pointer *)
                            ((long)&pEVar6[uVar9].expression_of_set.
                                    super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>
                                    ._M_impl + 8) - lVar13) / 0x18) <= uVar8) break;
        for (uVar12 = 0; lVar3 = *(long *)(lVar13 + uVar8 * 0x18),
            uVar12 < (ulong)(*(long *)(lVar13 + 8 + uVar8 * 0x18) - lVar3 >> 2); uVar12 = uVar12 + 1
            ) {
          lVar13 = (long)*(int *)(lVar3 + uVar12 * 4);
          if (lVar13 == -1) {
            std::operator<<((ostream *)&std::cout,"@");
          }
          else {
            std::operator<<((ostream *)&std::cout,(string *)&pEVar6[lVar13].super_Elem.name);
          }
          pEVar6 = (pvVar2->
                   super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar13 = *(long *)&pEVar6[uVar9].expression_of_set.
                             super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>
                             ._M_impl.super__Vector_impl_data;
        }
        std::operator<<((ostream *)&std::cout," | ");
        uVar8 = uVar8 + 1;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      uVar9 = local_208;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index," "
                     ,&pEVar6[uVar9].super_Elem.name);
      std::__cxx11::string::append((string *)&finnalyC);
      std::__cxx11::string::~string((string *)&index);
    }
    uVar9 = uVar9 + 1;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,(string *)&finnalyC);
  std::endl<char,std::char_traits<char>>(poVar5);
  get_tow_char_index(this);
  create_first_set(this);
  for (uVar9 = 0;
      uVar9 < (ulong)(((long)(this->elements).
                             super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->elements).
                            super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x48); uVar9 = uVar9 + 1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"first[");
    poVar5 = std::operator<<(poVar5,(string *)
                                    &(pvVar2->
                                     super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>
                                     )._M_impl.super__Vector_impl_data._M_start[uVar9].super_Elem.
                                     name);
    std::operator<<(poVar5,"]={");
    for (uVar8 = 0;
        pvVar7 = (this->first).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        lVar13 = *(long *)&pvVar7[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data,
        uVar8 < (ulong)((long)*(pointer *)
                               ((long)&pvVar7[uVar9].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data + 8) - lVar13 >> 2);
        uVar8 = uVar8 + 1) {
      lVar13 = (long)*(int *)(lVar13 + uVar8 * 4);
      poVar5 = (ostream *)&std::cout;
      pcVar10 = "@ ";
      if (lVar13 != -1) {
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 (string *)
                                 &(pvVar2->
                                  super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>
                                  )._M_impl.super__Vector_impl_data._M_start[lVar13].super_Elem.name
                                );
        pcVar10 = " ";
      }
      std::operator<<(poVar5,pcVar10);
    }
    std::operator<<((ostream *)&std::cout,"}\n");
  }
  this_00 = (local_200->
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_148,"#",&local_209);
  index = find_name(this,&local_148);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&index);
  std::__cxx11::string::~string((string *)&local_148);
  create_follow_set(this);
  uVar9 = 0;
  while( true ) {
    pEVar6 = (this->elements).
             super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->elements).
                       super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar6) / 0x48) <= uVar9)
    break;
    if (pEVar6[uVar9].super_Elem.is_finally == false) {
      poVar5 = std::operator<<((ostream *)&std::cout,"follow[");
      poVar5 = std::operator<<(poVar5,(string *)
                                      &(pvVar2->
                                       super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar9].super_Elem.
                                       name);
      std::operator<<(poVar5,"]={");
      for (uVar8 = 0;
          pvVar7 = (local_200->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
          lVar13 = *(long *)&pvVar7[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data,
          uVar8 < (ulong)((long)*(pointer *)
                                 ((long)&pvVar7[uVar9].super__Vector_base<int,_std::allocator<int>_>
                                         ._M_impl.super__Vector_impl_data + 8) - lVar13 >> 2);
          uVar8 = uVar8 + 1) {
        lVar13 = (long)*(int *)(lVar13 + uVar8 * 4);
        poVar5 = (ostream *)&std::cout;
        pcVar10 = "@ ";
        if (lVar13 != -1) {
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   (string *)
                                   &(pvVar2->
                                    super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>
                                    )._M_impl.super__Vector_impl_data._M_start[lVar13].super_Elem.
                                    name);
          pcVar10 = " ";
        }
        std::operator<<(poVar5,pcVar10);
      }
      std::operator<<((ostream *)&std::cout,"}\n");
    }
    uVar9 = uVar9 + 1;
  }
  get_predict_table(this);
  uVar9 = 0;
  while( true ) {
    pvVar7 = (this->predict_table).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->predict_table).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7) / 0x18) <= uVar9)
    break;
    for (uVar8 = 0;
        lVar13 = *(long *)&pvVar7[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data,
        uVar8 < (ulong)((long)*(pointer *)
                               ((long)&pvVar7[uVar9].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data + 8) - lVar13 >> 2);
        uVar8 = uVar8 + 1) {
      poVar5 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,*(int *)(lVar13 + uVar8 * 4));
      std::operator<<(poVar5," ");
      pvVar7 = (this->predict_table).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    uVar9 = uVar9 + 1;
  }
  std::__cxx11::string::~string((string *)&finnalyC);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&result_of_name);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&vectorGenrates);
  return;
}

Assistant:

GrammarLeft::GrammarLeft(string* generate, int length){
    //1.解析所有字符串
    vector<vector<string>> vectorGenrates;//这个是用来存放各个表达式

    //解析各个表达式,第一个是非终结符号，后面的是产生式
    for (int i = 0; i < length; i++){
        vector<string> temp;
        parse_productions(generate[i], temp);
        vectorGenrates.push_back(temp);
    }

    //2.添加非终结符添加到find表中,开始的非终结符就是length个
    for (int i = 0; i < length; i++){
        add_element(vectorGenrates[i][0], false);
    }

    //3.一个个解析产生式,会添加到find表中
    vector<string> result_of_name;
    for (int i = 0; i < length; i++){
        //ElemLeft N_F_E = elements[find_name(vectorGenrates[i][0])];//非终结符，接下来要对这个终结符进行exp的添加
        //对genrates[i]进行分析；
        for (int j = 1; j < vectorGenrates[i].size(); j++){
            parse_elem(vectorGenrates[i][j], result_of_name);
            vector<int> exp;
            for (int m = 0; m < result_of_name.size(); m++){
                int index = find_name(result_of_name[m]);
                if (index == -2){
                    index = add_element(result_of_name[m], true);
                }
                exp.push_back(index);

            }
            elements[find_name(vectorGenrates[i][0])].add_expression(ExpressLeft(exp));
        }
    }

    //4.消除左递归
    this->clear_left_recursion();
    //5.消除左因子
    this->clear_left_factor();

    add_element("#", true);
    //查看输入是不正确
    //测试一下：
    string finnalyC = "finnaly:";
    for (int i = 0; i < elements.size(); i++){
        if (!elements[i].is_finally){
            cout << elements[i].name << "->";
            for (int j = 0; j < elements[i].expression_of_set.size(); j++){
                for (int m = 0; m < elements[i].expression_of_set[j].expression.size(); m++){
                    if (elements[i].expression_of_set[j].expression[m] != -1){
                        cout << elements[elements[i].expression_of_set[j].expression[m]].name;
                    }
                    else
                    {
                        cout << "@";
                    }
                }
                cout << " | ";
            }
            cout << endl;
        }
        else
        {
            finnalyC += " " + elements[i].name;
        }
    }
    cout << finnalyC << endl;

    //6.两表生成（在5的时候就不会再添加新的符号了）
    //同时在这里初始化一下First和Follw表
    get_tow_char_index();

    //7.求first集合
    this->create_first_set();

    //检查一下，first集合
    for (int i = 0; i < elements.size(); i++){
        cout << "first[" << elements[i].name << "]={";
        for (int j = 0; j < first[i].size(); j++){
            if (first[i][j] == -1) cout << "@ ";
            else
            {
                cout << elements[first[i][j]].name << " ";
            }
        }
        cout << "}\n";
    }

    //8.求follow集合
    //将#送到开始符号
    this->follow[0].push_back(find_name("#"));
    this->create_follow_set();


    for (int i = 0; i < elements.size(); i++){

        if (elements[i].is_finally) continue;

        cout << "follow[" << elements[i].name << "]={";
        for (int j = 0; j < follow[i].size(); j++){
            if (follow[i][j] == -1) cout << "@ ";
            else
            {
                cout << elements[follow[i][j]].name << " ";
            }
        }
        cout << "}\n";
    }
    //9.构造预测分析表
    this->get_predict_table();


    for (int i = 0; i < predict_table.size(); i++){
        for (int j = 0; j < predict_table[i].size(); j++){
            cout << predict_table[i][j] << " ";
        }
        cout << endl;
    }

}